

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shader.cpp
# Opt level: O2

bool __thiscall
vera::Shader::load(Shader *this,string *_fragmentSrc,string *_vertexSrc,ShaderErrorResolve _onError,
                  bool _verbose)

{
  bool bVar1;
  GLuint GVar2;
  int iVar3;
  uint _lineNumber;
  ostream *poVar4;
  DefaultShaders extraout_EDX;
  DefaultShaders extraout_EDX_00;
  DefaultShaders DVar5;
  DefaultShaders _type;
  DefaultShaders extraout_EDX_01;
  DefaultShaders extraout_EDX_02;
  DefaultShaders extraout_EDX_03;
  DefaultShaders _type_00;
  DefaultShaders extraout_EDX_04;
  DefaultShaders _type_01;
  DefaultShaders _type_02;
  DefaultShaders _type_03;
  char *__s;
  string error;
  string lineNum;
  GLint infoLength;
  string *local_78;
  vector<char,_std::allocator<char>_> infoLog;
  GLint isLinked;
  string local_50;
  
  setVersionFromCode(_fragmentSrc);
  local_78 = (string *)&this->m_fragmentSource;
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_78,"");
  DVar5 = extraout_EDX;
  if (bVar1) {
LAB_00212244:
    getDefaultSrc_abi_cxx11_(&error,(vera *)0xb,DVar5);
    std::__cxx11::string::operator=(local_78,(string *)&error);
    std::__cxx11::string::~string((string *)&error);
    getDefaultSrc_abi_cxx11_(&error,(vera *)0xa,_type);
    std::__cxx11::string::operator=((string *)&this->m_vertexSource,(string *)&error);
    std::__cxx11::string::~string((string *)&error);
  }
  else {
    bVar1 = std::operator==(&this->m_vertexSource,"");
    DVar5 = extraout_EDX_00;
    if (bVar1) goto LAB_00212244;
  }
  GVar2 = compileShader(this,_vertexSrc,0x8b31,false);
  this->m_vertexShader = GVar2;
  if (GVar2 == 0) {
    if (_onError == REVERT_TO_PREVIOUS_SHADER) {
      if (_verbose) {
        __s = "Error compiling vertex shader, reverting to default shader";
LAB_0021265a:
        puts(__s);
      }
LAB_0021265f:
      load(this,&this->m_previousFragmentSource,&this->m_previousVertexSource,SHOW_MAGENTA_SHADER,
           _verbose);
    }
    else {
      if (_onError != SHOW_MAGENTA_SHADER) goto LAB_002122c2;
      DVar5 = extraout_EDX_01;
      if (_verbose) {
        puts("Error compiling vertex shader, loading magenta shader");
        DVar5 = extraout_EDX_03;
      }
      getDefaultSrc_abi_cxx11_(&error,(vera *)0xb,DVar5);
      getDefaultSrc_abi_cxx11_(&lineNum,(vera *)0xa,_type_00);
      load(this,&error,&lineNum,DONT_KEEP_SHADER,_verbose);
LAB_0021245d:
      std::__cxx11::string::~string((string *)&lineNum);
      std::__cxx11::string::~string((string *)&error);
    }
    bVar1 = false;
  }
  else {
LAB_002122c2:
    GVar2 = compileShader(this,_fragmentSrc,0x8b30,false);
    this->m_fragmentShader = GVar2;
    if (GVar2 == 0) {
      if (_onError == REVERT_TO_PREVIOUS_SHADER) {
        if (_verbose) {
          __s = "Error compiling fragment shader, reverting to default shader";
          goto LAB_0021265a;
        }
        goto LAB_0021265f;
      }
      if (_onError == SHOW_MAGENTA_SHADER) {
        DVar5 = extraout_EDX_02;
        if (_verbose) {
          puts("Error compiling fragment shader, loading magenta shader");
          DVar5 = extraout_EDX_04;
        }
        getDefaultSrc_abi_cxx11_(&error,(vera *)0xb,DVar5);
        getDefaultSrc_abi_cxx11_(&lineNum,(vera *)0xa,_type_01);
        load(this,&error,&lineNum,DONT_KEEP_SHADER,_verbose);
        goto LAB_0021245d;
      }
    }
    if (this->m_program != 0) {
      glDeleteProgram();
    }
    GVar2 = glCreateProgram();
    this->m_program = GVar2;
    glAttachShader(GVar2,this->m_vertexShader);
    glAttachShader(this->m_program,this->m_fragmentShader);
    glLinkProgram(this->m_program);
    if (_onError != DONT_KEEP_SHADER) {
      std::__cxx11::string::_M_assign(local_78);
      std::__cxx11::string::_M_assign((string *)&this->m_vertexSource);
      std::__cxx11::string::_M_assign((string *)&this->m_previousFragmentSource);
      std::__cxx11::string::_M_assign((string *)&this->m_previousVertexSource);
    }
    glGetProgramiv(this->m_program,0x8b82,&isLinked);
    bVar1 = isLinked != 0;
    if (isLinked == 0) {
      infoLength = 0;
      glGetProgramiv(this->m_program,0x8b84,&infoLength);
      if (1 < (long)infoLength) {
        std::vector<char,_std::allocator<char>_>::vector
                  (&infoLog,(long)infoLength,(allocator_type *)&error);
        glGetProgramInfoLog(this->m_program,infoLength,0,
                            infoLog.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start);
        error._M_dataplus._M_p = (pointer)&error.field_2;
        std::__cxx11::string::
        _M_construct<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                  ((string *)&error,
                   infoLog.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   infoLog.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_finish);
        poVar4 = std::operator<<((ostream *)&std::cerr,"Error linking shader: ");
        poVar4 = std::operator<<(poVar4,(string *)&error);
        std::endl<char,std::char_traits<char>>(poVar4);
        std::__cxx11::string::find((char *)&error,0x300801);
        std::__cxx11::string::find_last_of((char *)&error,0x2cd484);
        std::__cxx11::string::substr((ulong)&lineNum,(ulong)&error);
        iVar3 = toInt(&lineNum);
        if (0 < iVar3) {
          toInt(&lineNum);
          poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
          poVar4 = std::operator<<(poVar4,": ");
          _lineNumber = toInt(&lineNum);
          getLineNumber(&local_50,_fragmentSrc,_lineNumber);
          poVar4 = std::operator<<(poVar4,(string *)&local_50);
          std::endl<char,std::char_traits<char>>(poVar4);
          std::__cxx11::string::~string((string *)&local_50);
        }
        std::__cxx11::string::~string((string *)&lineNum);
        std::__cxx11::string::~string((string *)&error);
        std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                  (&infoLog.super__Vector_base<char,_std::allocator<char>_>);
      }
      if (_verbose) {
        puts("Linking fail, deleting program and loading error shader");
      }
      glDeleteProgram(this->m_program);
      getDefaultSrc_abi_cxx11_(&error,(vera *)0xb,_type_02);
      getDefaultSrc_abi_cxx11_(&lineNum,(vera *)0xa,_type_03);
      load(this,&error,&lineNum,DONT_KEEP_SHADER,_verbose);
      std::__cxx11::string::~string((string *)&lineNum);
      std::__cxx11::string::~string((string *)&error);
    }
    else {
      glDeleteShader(this->m_vertexShader);
      glDeleteShader(this->m_fragmentShader);
      this->m_needsReloading = false;
    }
  }
  return bVar1;
}

Assistant:

bool Shader::load(const std::string& _fragmentSrc, const std::string& _vertexSrc, ShaderErrorResolve _onError, bool _verbose) {
    setVersionFromCode(_fragmentSrc);
    if (m_fragmentSource == "" || m_vertexSource == "") {
        m_fragmentSource = getDefaultSrc(FRAG_ERROR);
        m_vertexSource = getDefaultSrc(VERT_ERROR);
    }


    // VERTEX
    m_vertexShader = compileShader(_vertexSrc, GL_VERTEX_SHADER, _verbose);
    if (!m_vertexShader) {
        if (_onError == SHOW_MAGENTA_SHADER) {
            if (_verbose)
                printf("Error compiling vertex shader, loading magenta shader\n");
            load(getDefaultSrc(FRAG_ERROR), getDefaultSrc(VERT_ERROR), DONT_KEEP_SHADER, _verbose);
            return false;
        }
        else if (_onError == REVERT_TO_PREVIOUS_SHADER) {
            if (_verbose)
                printf("Error compiling vertex shader, reverting to default shader\n");
            load(m_previousFragmentSource, m_previousVertexSource, SHOW_MAGENTA_SHADER, _verbose);
            return false;
        }
    }

    // FRAGMENT
    m_fragmentShader = compileShader(_fragmentSrc, GL_FRAGMENT_SHADER, _verbose);
    if (!m_fragmentShader) {
        if (_onError == SHOW_MAGENTA_SHADER) {
            if (_verbose)
                printf("Error compiling fragment shader, loading magenta shader\n");
            load(getDefaultSrc(FRAG_ERROR), getDefaultSrc(VERT_ERROR), DONT_KEEP_SHADER, _verbose);
            return false;
        }
        else if (_onError == REVERT_TO_PREVIOUS_SHADER) {
            if (_verbose)
                printf("Error compiling fragment shader, reverting to default shader\n");
            load(m_previousFragmentSource, m_previousVertexSource, SHOW_MAGENTA_SHADER, _verbose);
            return false;
        }
    }

    // PROGRAM
    if (m_program != 0)
        glDeleteProgram(m_program);
    m_program = glCreateProgram();
    glAttachShader(m_program, m_vertexShader);
    glAttachShader(m_program, m_fragmentShader);
    glLinkProgram(m_program);

    // SUCCESS
    if (_onError != DONT_KEEP_SHADER) {
        // we need to explicitely remember the previous shader or REVERT_TO_PREVIOUS_SHADER always falls through to SHOW_MAGENTA_SHADER.
        m_fragmentSource = _fragmentSrc;
        m_vertexSource = _vertexSrc;
        m_previousFragmentSource = _fragmentSrc;
        m_previousVertexSource = _vertexSrc;
    }

    GLint isLinked;
    glGetProgramiv(m_program, GL_LINK_STATUS, &isLinked);

    if (isLinked == GL_FALSE) {
        GLint infoLength = 0;
        glGetProgramiv(m_program, GL_INFO_LOG_LENGTH, &infoLength);

        #if !defined(SWIG)
        if (infoLength > 1) {
            std::vector<GLchar> infoLog(infoLength);
            glGetProgramInfoLog(m_program, infoLength, NULL, &infoLog[0]);
            std::string error(infoLog.begin(),infoLog.end());
            // printf("Error linking shader:\n%s\n", error);
            std::cerr << "Error linking shader: " << error << std::endl;

            std::size_t start = error.find("line ")+5;
            std::size_t end = error.find_last_of(")");
            std::string lineNum = error.substr(start,end-start);
            if (toInt(lineNum) > 0)
                std::cerr << (unsigned)toInt(lineNum) << ": " << getLineNumber(_fragmentSrc,(unsigned)toInt(lineNum)) << std::endl;
        }
        #endif

        if (_verbose)
            printf("Linking fail, deleting program and loading error shader\n");
        glDeleteProgram(m_program);
        load(getDefaultSrc(FRAG_ERROR), getDefaultSrc(VERT_ERROR), DONT_KEEP_SHADER, _verbose);
        return false;
    }
    else {
        glDeleteShader(m_vertexShader);
        glDeleteShader(m_fragmentShader);

        m_needsReloading = false;
        // m_defineChange = false;
        return true;
    }
}